

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise_x86::create_group_ops(DeconvolutionDepthWise_x86 *this,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  _func_int *p_Var4;
  pointer ppLVar5;
  pointer ppLVar6;
  int *piVar7;
  long *plVar8;
  ulong uVar9;
  Layer *pLVar10;
  uint uVar11;
  int iVar12;
  void *in_R8;
  int i;
  long lVar13;
  long lVar14;
  uint i_00;
  bool bVar15;
  undefined4 local_180;
  Mat local_178;
  long local_130;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined8 local_110;
  uint local_108;
  undefined4 uStack_104;
  uint uStack_100;
  ulong uStack_fc;
  long local_f0;
  int local_e4;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_e0;
  long local_d8;
  undefined8 local_d0;
  long local_c8;
  ulong local_c0;
  Mat local_b8;
  long local_70;
  Option *local_68;
  undefined1 *local_60;
  size_t local_58;
  ModelBinFromMatArray local_50;
  ParamDict pd;
  
  p_Var4 = this->_vptr_DeconvolutionDepthWise_x86[-3];
  iVar1 = *(int *)(&this->field_0xd0 + (long)p_Var4);
  iVar12 = *(int *)(&this->field_0xd8 + (long)p_Var4) * *(int *)(&this->field_0xd4 + (long)p_Var4);
  iVar2 = *(int *)(&this->field_0x114 + (long)p_Var4);
  uVar9 = (long)*(int *)(&this->field_0x110 + (long)p_Var4) / (long)iVar2;
  uVar9 = (long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) / (long)iVar12;
  local_e0 = &this->group_ops;
  lVar13 = 0;
  local_68 = opt;
  while( true ) {
    ppLVar5 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppLVar6 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppLVar6 - (long)ppLVar5) >> 3) <= lVar13) break;
    if (ppLVar5[lVar13] != (Layer *)0x0) {
      (*ppLVar5[lVar13]->_vptr_Layer[1])();
    }
    lVar13 = lVar13 + 1;
  }
  if (ppLVar6 != ppLVar5) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar5;
  }
  iVar3 = *(int *)(&this->field_0x114 + (long)this->_vptr_DeconvolutionDepthWise_x86[-3]);
  i_00 = *(int *)(&this->field_0xd0 + (long)this->_vptr_DeconvolutionDepthWise_x86[-3]) / iVar3;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_e0,(long)iVar3);
  local_60 = &this->field_0x120;
  local_e4 = (((int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
                    (long)(iVar1 / iVar2)) * iVar2) / iVar3) * iVar12 * i_00;
  local_58 = (size_t)local_e4;
  local_70 = (long)(int)i_00;
  for (lVar13 = 0; p_Var4 = this->_vptr_DeconvolutionDepthWise_x86[-3],
      lVar13 < *(int *)(&this->field_0x114 + (long)p_Var4); lVar13 = lVar13 + 1) {
    lVar14 = *(long *)(&this->field_0x178 + (long)p_Var4);
    local_178.data =
         (void *)(lVar13 * local_58 * lVar14 + *(long *)(&this->field_0x168 + (long)p_Var4));
    local_178.elempack = *(int *)(&this->field_0x180 + (long)p_Var4);
    local_178.allocator = *(Allocator **)(&this->field_0x188 + (long)p_Var4);
    local_178.refcount._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.elemsize._0_4_ = (undefined4)lVar14;
    local_178.elemsize._4_4_ = (undefined4)((ulong)lVar14 >> 0x20);
    local_178.dims = 1;
    local_178.w = (int)local_58;
    local_178.h = 1;
    local_178.d = 1;
    local_178.cstep = local_58;
    local_178.c = local_178.dims;
    Mat::clone(&local_b8,(__fn *)&local_178,(void *)0x0,1,in_R8);
    piVar7 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_178.allocator == (Allocator *)0x0) {
          free(local_178.data);
        }
        else {
          (*(local_178.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    p_Var4 = this->_vptr_DeconvolutionDepthWise_x86[-3];
    bVar15 = *(int *)(&this->field_0x10c + (long)p_Var4) == 0;
    if (bVar15) {
      local_c0 = 0;
      local_d0 = 0;
      local_180 = 0;
      local_c8 = 0;
      lVar14 = 0;
      local_d8 = 0;
    }
    else {
      local_c8 = *(long *)(&this->field_0x1c0 + (long)p_Var4);
      lVar14 = lVar13 * local_70 * local_c8 + *(long *)(&this->field_0x1b0 + (long)p_Var4);
      local_180 = *(undefined4 *)(&this->field_0x1c8 + (long)p_Var4);
      local_d0 = *(undefined8 *)(&this->field_0x1d0 + (long)p_Var4);
      local_c0 = (ulong)i_00;
      local_d8 = local_70;
    }
    bVar15 = !bVar15;
    uVar11 = (uint)bVar15;
    pLVar10 = create_layer(8);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,i_00);
    ParamDict::set(&pd,1,*(int *)(&this->field_0xd4 +
                                 (long)this->_vptr_DeconvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,0xb,*(int *)(&this->field_0xd8 +
                                   (long)this->_vptr_DeconvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,2,*(int *)(&this->field_0xdc +
                                 (long)this->_vptr_DeconvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,0xc,*(int *)(&this->field_0xe0 +
                                   (long)this->_vptr_DeconvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,3,*(int *)(&this->field_0xe4 +
                                 (long)this->_vptr_DeconvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,0xd,*(int *)(&this->field_0xe8 +
                                   (long)this->_vptr_DeconvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,4,0);
    ParamDict::set(&pd,0xe,0);
    ParamDict::set(&pd,0x12,*(int *)(&this->field_0xfc +
                                    (long)this->_vptr_DeconvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,0x13,*(int *)(&this->field_0x100 +
                                    (long)this->_vptr_DeconvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,5,*(int *)(&this->field_0x10c +
                                 (long)this->_vptr_DeconvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,6,local_e4);
    ParamDict::set(&pd,9,*(int *)(&this->field_0x118 +
                                 (long)this->_vptr_DeconvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,10,(Mat *)(local_60 + (long)this->_vptr_DeconvolutionDepthWise_x86[-3]));
    (*pLVar10->_vptr_Layer[2])(pLVar10,&pd);
    local_178.refcount._0_4_ = SUB84(local_b8.refcount,0);
    local_178.refcount._4_4_ = (undefined4)((ulong)local_b8.refcount >> 0x20);
    local_178.elemsize._0_4_ = (undefined4)local_b8.elemsize;
    local_178.elemsize._4_4_ = (undefined4)(local_b8.elemsize >> 0x20);
    if (*(int *)(&this->field_0x10c + (long)this->_vptr_DeconvolutionDepthWise_x86[-3]) == 0) {
      if (local_b8.refcount != (int *)0x0) {
        LOCK();
        *local_b8.refcount = *local_b8.refcount + 1;
        UNLOCK();
      }
      local_178.data = local_b8.data;
      local_178.elempack = local_b8.elempack;
      local_178.allocator = local_b8.allocator;
      local_178.c = local_b8.c;
      local_178.cstep = local_b8.cstep;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_50,&local_178);
      (*pLVar10->_vptr_Layer[3])(pLVar10,&local_50);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_50);
      piVar7 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_178.allocator == (Allocator *)0x0) {
            free(local_178.data);
          }
          else {
            (*(local_178.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      if (local_b8.refcount != (int *)0x0) {
        LOCK();
        *local_b8.refcount = *local_b8.refcount + 1;
        UNLOCK();
      }
      local_178.cstep = local_b8.cstep;
      local_178.c = local_b8.c;
      local_178.allocator = local_b8.allocator;
      local_178.elempack = local_b8.elempack;
      local_178.data = local_b8.data;
      uStack_128 = 0;
      uStack_124 = 0;
      uStack_120 = (undefined4)local_c8;
      uStack_11c = (undefined4)((ulong)local_c8 >> 0x20);
      uStack_118 = local_180;
      local_110 = local_d0;
      uStack_104 = (undefined4)local_c0;
      uStack_fc = (ulong)CONCAT14(bVar15,uVar11);
      local_f0 = local_d8;
      local_130 = lVar14;
      local_108 = uVar11;
      uStack_100 = uVar11;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_50,&local_178);
      (*pLVar10->_vptr_Layer[3])(pLVar10,&local_50);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_50);
      lVar14 = 0x48;
      do {
        piVar7 = *(int **)((long)&local_178.refcount + lVar14);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            plVar8 = *(long **)((long)&local_178.allocator + lVar14);
            if (plVar8 == (long *)0x0) {
              free(*(void **)((long)&local_178.data + lVar14));
            }
            else {
              (**(code **)(*plVar8 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_178.cstep + lVar14) = 0;
        *(undefined8 *)((long)&local_178.refcount + lVar14 + 4) = 0;
        *(undefined8 *)((long)&local_178.elemsize + lVar14 + 4) = 0;
        *(undefined8 *)((long)&local_178.data + lVar14) = 0;
        *(undefined8 *)((long)&local_178.refcount + lVar14) = 0;
        *(undefined4 *)((long)&local_178.c + lVar14) = 0;
        *(undefined8 *)((long)&local_178.dims + lVar14) = 0;
        *(undefined8 *)((long)&local_178.h + lVar14) = 0;
        lVar14 = lVar14 + -0x48;
      } while (lVar14 != -0x48);
    }
    (*pLVar10->_vptr_Layer[4])(pLVar10,local_68);
    (local_e0->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
    super__Vector_impl_data._M_start[lVar13] = pLVar10;
    ParamDict::~ParamDict(&pd);
    if (local_b8.refcount != (int *)0x0) {
      LOCK();
      *local_b8.refcount = *local_b8.refcount + -1;
      UNLOCK();
      if (*local_b8.refcount == 0) {
        if (local_b8.allocator == (Allocator *)0x0) {
          free(local_b8.data);
        }
        else {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return 0;
}

Assistant:

int DeconvolutionDepthWise_x86::create_group_ops(const Option& opt)
{
    // create Deconvolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g).clone();
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Deconvolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(18, output_pad_right);
        pd.set(19, output_pad_bottom);
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data_g;

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}